

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

bool __thiscall duckdb::QueryProfiler::PrintOptimizerOutput(QueryProfiler *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((this->context->config).profiler_print_format != QUERY_TREE_OPTIMIZER) {
    if (this->is_explain_analyze == false) {
      return (this->context->config).enable_detailed_profiling;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

ProfilerPrintFormat QueryProfiler::GetPrintFormat(ExplainFormat format) const {
	auto print_format = ClientConfig::GetConfig(context).profiler_print_format;
	if (format == ExplainFormat::DEFAULT) {
		return print_format;
	}
	switch (format) {
	case ExplainFormat::TEXT:
		return ProfilerPrintFormat::QUERY_TREE;
	case ExplainFormat::JSON:
		return ProfilerPrintFormat::JSON;
	case ExplainFormat::HTML:
		return ProfilerPrintFormat::HTML;
	case ExplainFormat::GRAPHVIZ:
		return ProfilerPrintFormat::GRAPHVIZ;
	default:
		throw NotImplementedException("No mapping from ExplainFormat::%s to ProfilerPrintFormat",
		                              EnumUtil::ToString(format));
	}
}